

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O2

bool __thiscall
RSTARPlanner::Search
          (RSTARPlanner *this,vector<int,_std::allocator<int>_> *pathIds,int *PathCost,
          bool bFirstSolution,bool bOptimalSolution,double MaxNumofSecs)

{
  pointer piVar1;
  RSTARSearchStateSpace_t *pRVar2;
  DiscreteSpaceInformation *pDVar3;
  pointer ppiVar4;
  void *pvVar5;
  long lVar6;
  int iVar7;
  clock_t cVar8;
  double dVar9;
  int CurrentPathCost;
  vector<int,_std::allocator<int>_> CurrentPathIds;
  int local_84;
  double local_80;
  _Vector_base<int,_std::allocator<int>_> local_78;
  pointer local_60;
  vector<int,_std::allocator<int>_> *local_58;
  double local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_80 = MaxNumofSecs;
  cVar8 = clock();
  this->TimeStarted = cVar8;
  this->highlevel_searchexpands = 0;
  this->lowlevel_searchexpands = 0;
  *PathCost = 1000000000;
  piVar1 = (pathIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((pathIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (pathIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  pRVar2 = this->pSearchStateSpace;
  pRVar2->eps = this->finitial_eps;
  pRVar2->eps_satisfied = 1000000000.0;
  if (pRVar2->bReinitializeSearchStateSpace == true) {
    ReInitializeSearchStateSpace(this);
  }
  if (bOptimalSolution) {
    this->pSearchStateSpace->eps = 1.0;
  }
  else if (!bFirstSolution) goto LAB_00143975;
  local_80 = 1000000000.0;
LAB_00143975:
  pDVar3 = (this->super_SBPLPlanner).environment_;
  local_60 = (pDVar3->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppiVar4 = (pDVar3->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_50 = local_80 * 1000000.0;
  local_58 = pathIds;
  while( true ) {
    dVar9 = this->pSearchStateSpace->eps_satisfied;
    if ((dVar9 < this->final_epsilon || dVar9 == this->final_epsilon) ||
       (cVar8 = clock(), local_50 <= (double)(cVar8 - this->TimeStarted))) goto LAB_00143b28;
    clock();
    pRVar2 = this->pSearchStateSpace;
    if (ABS(pRVar2->eps_satisfied - pRVar2->eps) < 1e-07 && !bFirstSolution) {
      dVar9 = pRVar2->eps - this->dec_eps;
      pRVar2->eps = dVar9;
      if (dVar9 < this->final_epsilon) {
        pRVar2->eps = this->final_epsilon;
      }
      pRVar2->bReevaluatefvals = true;
      pRVar2->bReinitializeSearchStateSpace = true;
      pRVar2->bNewSearchIteration = true;
    }
    ReInitializeSearchStateSpace(this);
    pRVar2 = this->pSearchStateSpace;
    if (pRVar2->bNewSearchIteration == true) {
      pRVar2->searchiteration = pRVar2->searchiteration + 1;
      pRVar2->bNewSearchIteration = false;
    }
    if (pRVar2->bReevaluatefvals == true) {
      Reevaluatefvals(this);
    }
    iVar7 = ImprovePath(this,local_80);
    pRVar2 = this->pSearchStateSpace;
    if (iVar7 == 1) {
      pRVar2->eps_satisfied = pRVar2->eps;
    }
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pvVar5 = pRVar2->searchgoalstate->PlannerSpecificData;
    local_84 = *(int *)((long)pvVar5 + 0x20);
    iVar7 = 1000000000;
    if ((local_84 != 1000000000) &&
       (lVar6 = *(long *)(*(long *)((long)pvVar5 + 0x28) + 0x50),
       *(long *)(lVar6 + 0x10) != *(long *)(lVar6 + 8))) {
      GetSearchPath((vector<int,_std::allocator<int>_> *)&local_48,this,&local_84);
      std::vector<int,_std::allocator<int>_>::_M_move_assign
                ((vector<int,_std::allocator<int>_> *)&local_78,&local_48);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
      iVar7 = local_84;
    }
    if (iVar7 < *PathCost) {
      *PathCost = iVar7;
      std::vector<int,_std::allocator<int>_>::operator=
                (local_58,(vector<int,_std::allocator<int>_> *)&local_78);
    }
    if (bFirstSolution) break;
    iVar7 = *(int *)((long)this->pSearchStateSpace->searchgoalstate->PlannerSpecificData + 0x20);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
    if (iVar7 == 1000000000) {
LAB_00143b28:
      pDVar3 = (this->super_SBPLPlanner).environment_;
      this->MaxMemoryCounter =
           this->MaxMemoryCounter +
           ((int)((ulong)((long)ppiVar4 - (long)local_60) >> 3) -
           (int)((ulong)((long)(pDVar3->StateID2IndexMapping).
                               super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pDVar3->StateID2IndexMapping).
                              super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3)) * 4;
      return *PathCost != 1000000000;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  goto LAB_00143b28;
}

Assistant:

bool RSTARPlanner::Search(vector<int>& pathIds, int & PathCost, bool bFirstSolution, bool bOptimalSolution,
                          double MaxNumofSecs)
{
    CKey key;
    TimeStarted = clock();
    highlevel_searchexpands = 0;
    lowlevel_searchexpands = 0;

    //reset the return values
    PathCost = INFINITECOST;
    pathIds.clear();

    //bFirstSolution = false; //TODO-remove this but then fix crashing because later
    //searches within cycle re-initialize g-vals and test path found fails if last search ran out of time
    //so we need to save solutions between iterations
    //also, we need to call change callnumber before each search

#if DEBUG
    SBPL_FPRINTF(fDeb, "new search call (call number=%d)\n", pSearchStateSpace->callnumber);
#endif

    //set epsilons
    pSearchStateSpace->eps = this->finitial_eps;
    pSearchStateSpace->eps_satisfied = INFINITECOST;

    if (pSearchStateSpace->bReinitializeSearchStateSpace == true) {
        //re-initialize state space
        ReInitializeSearchStateSpace();
    }

    if (bOptimalSolution) {
        pSearchStateSpace->eps = 1;
        MaxNumofSecs = INFINITECOST;
    }
    else if (bFirstSolution) {
        MaxNumofSecs = INFINITECOST;
    }

    //get the size of environment that is already allocated
    int oldenvsize = environment_->StateID2IndexMapping.size() * sizeof(int);

    //the main loop of R*
    int prevexpands = 0;
    clock_t loop_time;
    //TODO - change FINAL_EPS and DECREASE_EPS onto a parameter
    while (pSearchStateSpace->eps_satisfied > final_epsilon &&
           (clock() - TimeStarted) < MaxNumofSecs * (double)CLOCKS_PER_SEC)
    {
        loop_time = clock();

        //decrease eps for all subsequent iterations
        if (fabs(pSearchStateSpace->eps_satisfied - pSearchStateSpace->eps) < ERR_EPS && !bFirstSolution) {
            pSearchStateSpace->eps = pSearchStateSpace->eps - dec_eps;
            if (pSearchStateSpace->eps < final_epsilon) pSearchStateSpace->eps = final_epsilon;

            //the priorities need to be updated
            pSearchStateSpace->bReevaluatefvals = true;

            //it will be a new search. Since R* is non-incremental, it will have to be a new call
            pSearchStateSpace->bNewSearchIteration = true;
            pSearchStateSpace->bReinitializeSearchStateSpace = true;
        }

        //if(pSearchStateSpace->bReinitializeSearchStateSpace == true){
        //re-initialize state space
        ReInitializeSearchStateSpace(); //TODO - we have to do it currently since g-vals from old searches are invalid
        //}

        if (pSearchStateSpace->bNewSearchIteration) {
            pSearchStateSpace->searchiteration++;
            pSearchStateSpace->bNewSearchIteration = false;
        }

        //re-compute f-values if necessary and reorder the heap
        if (pSearchStateSpace->bReevaluatefvals) Reevaluatefvals();

        //improve or compute path
        if (ImprovePath(MaxNumofSecs) == 1) {
            pSearchStateSpace->eps_satisfied = pSearchStateSpace->eps; //note: eps is satisfied probabilistically
        }

        //print the solution cost and eps bound
        SBPL_PRINTF("eps=%f highlevel expands=%d g(searchgoal)=%d time=%.3f\n", pSearchStateSpace->eps_satisfied,
                    highlevel_searchexpands - prevexpands,
                    ((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g,
                    double(clock() - loop_time) / CLOCKS_PER_SEC);

#if DEBUG
        SBPL_FPRINTF(fDeb, "eps=%f highlevel expands=%d g(searchgoal)=%d time=%.3f\n",
                     pSearchStateSpace->eps_satisfied, highlevel_searchexpands - prevexpands,
                     ((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g,
                     double(clock()-loop_time)/CLOCKS_PER_SEC);
        PrintSearchState((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData, fDeb);
#endif
        prevexpands = highlevel_searchexpands;

        //keep track of the best solution so far
        vector<int> CurrentPathIds;
        int CurrentPathCost = ((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;
        if (CurrentPathCost == INFINITECOST ||
            ((RSTARACTIONDATA*)((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->bestpredaction->PlannerSpecificData)->pathIDs.size() == 0)
        {
            //the path to the goal is not found, it is just goal has been
            //generated but the last edge to it wasn't computed yet
            CurrentPathCost = INFINITECOST;
        }
        else {
            //get the found path
            CurrentPathIds = GetSearchPath(CurrentPathCost);
        }
        //keep track of the best solution
        if (CurrentPathCost < PathCost) {
            PathCost = CurrentPathCost;
            pathIds = CurrentPathIds;
        }

        //if just the first solution then we are done
        if (bFirstSolution) break;

        //no solution exists
        if (((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g == INFINITECOST) break;
    }

#if DEBUG
    SBPL_FFLUSH(fDeb);
#endif

    MaxMemoryCounter += (oldenvsize - environment_->StateID2IndexMapping.size() * sizeof(int));
    SBPL_PRINTF("MaxMemoryCounter = %d\n", MaxMemoryCounter);

    bool ret = false;
    if (PathCost == INFINITECOST) {
        SBPL_PRINTF("could not find a solution\n");
        ret = false;
    }
    else {
        SBPL_PRINTF("solution is found\n");
        ret = true;
    }

    SBPL_PRINTF("total highlevel expands this call = %d, planning time = %.3f secs, solution cost=%d\n",
                highlevel_searchexpands, (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC), PathCost);

    //SBPL_FPRINTF(fStat, "%d %d\n", highlevel_searchexpands, MinPathCost);

    return ret;
}